

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

int CVmObjString::getp_splice(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  byte *__src;
  ushort uVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  vm_obj_id_t vVar6;
  long lVar7;
  ushort *puVar8;
  vm_val_t *pvVar9;
  uint uVar10;
  size_t __n;
  int iVar11;
  byte *pbVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  byte *pbVar17;
  void *__dest;
  vm_val_t new_ins_str;
  char ins_buf [128];
  vm_val_t local_c8;
  char local_b8 [136];
  
  if (argc == (uint *)0x0) {
    uVar14 = 0;
  }
  else {
    uVar14 = *argc;
  }
  if (getp_splice(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_splice();
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,argc,&getp_splice::desc);
  if (iVar4 == 0) {
    iVar4 = CVmBif::pop_int_val();
    iVar5 = CVmBif::pop_int_val();
    pvVar9 = sp_;
    uVar1 = *(ushort *)str;
    uVar13 = (ulong)uVar1;
    __src = (byte *)(str + 2);
    iVar15 = 0;
    if (uVar13 != 0) {
      iVar15 = 0;
      pbVar12 = __src;
      do {
        pbVar12 = pbVar12 + (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 & (uint)(*pbVar12 >> 7) * 3) + 1;
        iVar15 = iVar15 + 1;
      } while (pbVar12 < str + uVar13 + 2);
    }
    iVar11 = -1;
    if (iVar4 < 0) {
      iVar11 = iVar15;
    }
    iVar11 = iVar11 + iVar4;
    iVar4 = iVar15;
    if (iVar11 < iVar15) {
      iVar4 = iVar11;
    }
    if (iVar11 < 0) {
      iVar4 = 0;
    }
    iVar11 = iVar15 - iVar4;
    if (iVar5 < iVar15 - iVar4) {
      iVar11 = iVar5;
    }
    if (iVar5 < 0) {
      iVar11 = 0;
    }
    if (iVar4 == 0) {
      lVar16 = 2;
    }
    else {
      lVar7 = (long)iVar4;
      lVar16 = 2;
      do {
        lVar16 = lVar16 + (ulong)((((byte)str[lVar16] >> 5 & 1) != 0) + 1 &
                                 (uint)((byte)str[lVar16] >> 7) * 3) + 1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    uVar3 = *(undefined4 *)&self_val->field_0x4;
    aVar2 = self_val->val;
    sp_ = sp_ + 1;
    pvVar9->typ = self_val->typ;
    *(undefined4 *)&pvVar9->field_0x4 = uVar3;
    pvVar9->val = aVar2;
    local_c8.typ = VM_NIL;
    if ((uVar14 < 3) || (sp_[-2].typ == VM_NIL)) {
      __n = 0;
      puVar8 = (ushort *)0x0;
      pvVar9 = sp_;
    }
    else {
      puVar8 = (ushort *)cvt_to_str(&local_c8,local_b8,0x80,sp_ + -2,10,0);
      __n = (size_t)*puVar8;
      puVar8 = puVar8 + 1;
      pvVar9 = sp_;
    }
    sp_ = pvVar9 + 1;
    *(ulong *)pvVar9 = CONCAT44(local_c8._4_4_,local_c8.typ);
    pvVar9->val = local_c8.val;
    if ((iVar11 == 0) && (__n == 0)) {
      uVar3 = *(undefined4 *)&self_val->field_0x4;
      aVar2 = self_val->val;
      retval->typ = self_val->typ;
      *(undefined4 *)&retval->field_0x4 = uVar3;
      retval->val = aVar2;
    }
    else {
      pbVar17 = (byte *)(str + lVar16);
      pbVar12 = pbVar17;
      if (iVar11 != 0) {
        lVar7 = (long)iVar11;
        do {
          pbVar12 = pbVar12 + (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 & (uint)(*pbVar12 >> 7) * 3) +
                              1;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      vVar6 = create(0,(uVar13 + __n) - ((long)pbVar12 - (long)pbVar17));
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar6;
      lVar7 = *(long *)((long)&G_obj_table_X.pages_[vVar6 >> 0xc][vVar6 & 0xfff].ptr_ + 8);
      __dest = (void *)(lVar7 + 2);
      if (lVar16 != 2) {
        memcpy(__dest,__src,lVar16 - 2U);
        __dest = (void *)(lVar7 + lVar16);
      }
      if (__n != 0) {
        memcpy(__dest,puVar8,__n);
        __dest = (void *)((long)__dest + __n);
      }
      lVar16 = ((long)pbVar12 - (long)pbVar17) + (lVar16 - 2U);
      uVar10 = (uint)uVar1 - (int)lVar16;
      if (0 < (int)uVar10) {
        memcpy(__dest,__src + lVar16,(ulong)(uVar10 & 0x7fffffff));
      }
    }
    sp_ = sp_ + -(long)(int)uVar14;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_splice(VMG_ vm_val_t *retval,
                              const vm_val_t *self_val,
                              const char *str, uint *argc)
{
    char ins_buf[128];

    /* check arguments */
    uint oargc = (argc != 0 ? *argc : 0);
    static CVmNativeCodeDesc desc(2, 1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve the starting index and deletion length */
    int start_idx = CVmBif::pop_int_val(vmg0_);
    int del_char_len = CVmBif::pop_int_val(vmg0_);

    /* get and skip our length */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;
    utf8_ptr p((char *)str);
    int charlen = p.len(len);

    /* adjust the index to 0-based, and figure end-of-string offsets */
    start_idx += (start_idx < 0 ? charlen : -1);

    /* make sure the starting index and deletion length are in bounds */
    start_idx = (start_idx < 0 ? 0 :
                 start_idx > (int)charlen ? charlen :
                 start_idx);
    del_char_len = (del_char_len < 0 ? 0 :
                    del_char_len > (int)(charlen - start_idx) ? charlen - start_idx :
                    del_char_len);

    /* get the starting byte index */
    size_t start_byte_idx = p.bytelen(start_idx);

    /* save 'self' as gc protection */
    G_stk->push(self_val);
    
    /* 
     *   If there's an insertion string, get it as a string.  Treat nil as an
     *   empty insertion.  
     */
    size_t ins_byte_len = 0;
    const char *ins = 0;
    vm_val_t new_ins_str;
    new_ins_str.set_nil();
    if (oargc >= 3 && G_stk->get(1)->typ != VM_NIL)
    {
        /* 
         *   Leave the insertion string on the stack for gc protection, and
         *   do an explicit conversion to string.  
         */
        ins = cvt_to_str(vmg_ &new_ins_str, ins_buf, sizeof(ins_buf),
                         G_stk->get(1), 10, 0);
        ins_byte_len = vmb_get_len(ins);
        ins += VMB_LEN;
    }

    /* push the new insertion string (if any) for gc protection */
    G_stk->push(&new_ins_str);

    /* check to see if we're making any changes */
    if (del_char_len != 0 || ins_byte_len != 0)
    {
        /* figure the byte length to be deleted */
        size_t del_byte_len = utf8_ptr::s_bytelen(str + start_byte_idx, del_char_len);

        /* allocate a new string at the proper length */
        retval->set_obj(create(vmg_ FALSE, len + ins_byte_len - del_byte_len));
        CVmObjString *new_str = (CVmObjString *)vm_objp(vmg_ retval->val.obj);
        char *newp = new_str->cons_get_buf();

        /* copy the part of our string up to the starting index */
        if (start_byte_idx > 0)
        {
            memcpy(newp, str, start_byte_idx);
            newp += start_byte_idx;
        }

        /* if we have an insertion string, copy it */
        if (ins_byte_len != 0)
        {
            memcpy(newp, ins, ins_byte_len);
            newp += ins_byte_len;
        }

        /* if there's anything after the deleted section, add it */
        size_t tail_byte_idx = start_byte_idx + del_byte_len;
        int tail_byte_len = len - tail_byte_idx;
        if (tail_byte_len > 0)
            memcpy(newp, str + tail_byte_idx, tail_byte_len);
    }
    else
    {
        /* we're making no changes - return the original string */
        *retval = *self_val;
    }

    /* 
     *   discard the remaining arguments and the gc protection (original
     *   argc, minus 2 arg pops, plus 2 gc protection pushes -> oargc) 
     */
    G_stk->discard(oargc); 

    /* handled */
    return TRUE;
}